

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaCloneWildcardNsConstraints
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaWildcardPtr dest,xmlSchemaWildcardPtr source)

{
  xmlSchemaWildcardNsPtr pxVar1;
  xmlSchemaWildcardNsPtr pxVar2;
  int iVar3;
  xmlSchemaWildcardNsPtr pxVar4;
  
  iVar3 = -1;
  if (dest != (xmlSchemaWildcardPtr)0x0 && source != (xmlSchemaWildcardPtr)0x0) {
    dest->any = source->any;
    pxVar2 = (xmlSchemaWildcardNsPtr)&source->nsSet;
    pxVar4 = (xmlSchemaWildcardNsPtr)0x0;
    while (pxVar2 = pxVar2->next, pxVar2 != (xmlSchemaWildcardNsPtr)0x0) {
      pxVar1 = xmlSchemaNewWildcardNsConstraint(ctxt);
      if (pxVar1 == (xmlSchemaWildcardNsPtr)0x0) {
        return -1;
      }
      pxVar1->value = pxVar2->value;
      if (pxVar4 == (xmlSchemaWildcardNsPtr)0x0) {
        pxVar4 = (xmlSchemaWildcardNsPtr)&dest->nsSet;
      }
      pxVar4->next = pxVar1;
      pxVar4 = pxVar1;
    }
    if (dest->negNsSet != (xmlSchemaWildcardNsPtr)0x0) {
      xmlSchemaFreeWildcardNsSet(dest->negNsSet);
    }
    if (source->negNsSet == (xmlSchemaWildcardNsPtr)0x0) {
      dest->negNsSet = (xmlSchemaWildcardNsPtr)0x0;
    }
    else {
      pxVar2 = xmlSchemaNewWildcardNsConstraint(ctxt);
      dest->negNsSet = pxVar2;
      if (pxVar2 == (xmlSchemaWildcardNsPtr)0x0) {
        return -1;
      }
      pxVar2->value = source->negNsSet->value;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
xmlSchemaCloneWildcardNsConstraints(xmlSchemaParserCtxtPtr ctxt,
				    xmlSchemaWildcardPtr dest,
				    xmlSchemaWildcardPtr source)
{
    xmlSchemaWildcardNsPtr cur, tmp, last;

    if ((source == NULL) || (dest == NULL))
	return(-1);
    dest->any = source->any;
    cur = source->nsSet;
    last = NULL;
    while (cur != NULL) {
	tmp = xmlSchemaNewWildcardNsConstraint(ctxt);
	if (tmp == NULL)
	    return(-1);
	tmp->value = cur->value;
	if (last == NULL)
	    dest->nsSet = tmp;
	else
	    last->next = tmp;
	last = tmp;
	cur = cur->next;
    }
    if (dest->negNsSet != NULL)
	xmlSchemaFreeWildcardNsSet(dest->negNsSet);
    if (source->negNsSet != NULL) {
	dest->negNsSet = xmlSchemaNewWildcardNsConstraint(ctxt);
	if (dest->negNsSet == NULL)
	    return(-1);
	dest->negNsSet->value = source->negNsSet->value;
    } else
	dest->negNsSet = NULL;
    return(0);
}